

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
         *this)

{
  Precision PVar1;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CommandLine *this_01;
  TestContext *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar8;
  Statement *pSVar9;
  reference ppFVar10;
  ShaderExecutor *pSVar11;
  Variable<tcu::Vector<float,_4>_> *pVVar12;
  Variable<vkt::shaderexecutor::Void> *pVVar13;
  FloatFormat *pFVar14;
  IVal *pIVar15;
  reference pvVar16;
  reference pvVar17;
  FloatFormat *fmt_00;
  deUint32 in_stack_ffffffffffffea88;
  pointer local_1350;
  allocator<char> local_1309;
  string local_1308;
  undefined4 local_12e8;
  allocator<char> local_12e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e0;
  string local_12c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0;
  MessageBuilder local_1280;
  MessageBuilder local_1100;
  int local_f7c;
  MessageBuilder local_f78;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  undefined1 local_c38 [8];
  MessageBuilder builder;
  string local_ab0;
  double local_a90 [12];
  allocator<char> local_a29;
  string local_a28;
  undefined1 local_a08 [32];
  double local_9e8;
  double dStack_9e0;
  double local_9d8;
  double dStack_9d0;
  double local_9c8;
  double dStack_9c0;
  double local_9b8;
  double dStack_9b0;
  undefined1 local_9a8 [8];
  EvalContext ctx;
  IVal local_95e [4];
  IVal local_95a [2];
  IVal local_958;
  IVal local_8f8;
  undefined1 auStack_898 [8];
  IVal reference1_1;
  IVal reference0_1;
  pointer pVStack_7c8;
  bool result;
  size_t valueNdx;
  IVal reference1;
  IVal reference0;
  undefined1 local_6f8 [5];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  MessageBuilder local_670;
  _Self local_4f0;
  _Self local_4e8;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_338;
  reference local_1b8;
  void *outputArr [2];
  void *inputArr [4];
  TestLog *testLog;
  ResultCollector status;
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_> outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  *this_local;
  
  this_00 = this->m_samplings;
  fmt_00 = &(this->m_caseCtx).floatFormat;
  PVar1 = (this->m_caseCtx).precision;
  sVar2 = (this->m_caseCtx).numRandoms;
  inputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_01 = tcu::TestContext::getCommandLine((this->m_caseCtx).testContext);
  iVar6 = tcu::CommandLine::getBaseSeed(this_01);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)&fmt,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt_00,(FloatFormat *)(ulong)PVar1,(Precision)sVar2,(ulong)(iVar6 + 0xdeadbeef),
             in_stack_ffffffffffffea88);
  iVar6 = numInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                    ();
  iVar7 = numOutputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,4>,tcu::Vector<float,4>>>();
  if (iVar6 < 1) {
    local_1350 = (pointer)0x1;
  }
  else {
    local_1350 = (pointer)std::
                          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                          size((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)&fmt);
  }
  outputs.out1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_1350;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>::Outputs
            ((Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
              *)&highpFmt.m_maxValue,(size_t)local_1350);
  highpFmt._24_8_ = (this->m_caseCtx).highpFormat.m_maxValue;
  numErrors = (this->m_caseCtx).highpFormat.m_minExp;
  unique0x10001237 = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)((long)&status.m_message.field_2 + 8));
  tcu::ResultCollector::ResultCollector((ResultCollector *)&testLog);
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  this_03 = tcu::TestContext::getLog(this_02);
  outputArr[1] = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::front
                           ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&fmt);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::front
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &highpFmt.m_maxValue);
  outputArr[0] = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::front
                           ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&outputs.out0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::TestLog::operator<<(&local_338,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [12])"Statement: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         *)&it);
  pSVar9 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                     (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  Statement::getUsedFuncs
            (pSVar9,(set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                     *)&it);
  local_4e8._M_node =
       (_Base_ptr)
       std::
       set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
       ::begin((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
  while( true ) {
    local_4f0._M_node =
         (_Base_ptr)
         std::
         set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         ::end((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
    bVar4 = std::operator!=(&local_4e8,&local_4f0);
    if (!bVar4) break;
    ppFVar10 = std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator*
                         (&local_4e8);
    FuncBase::printDefinition
              (*ppFVar10,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator++(&local_4e8);
  }
  bVar4 = std::
          set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          ::empty((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                   *)&it);
  if (!bVar4) {
    tcu::TestLog::operator<<(&local_670,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_670,(char (*) [24])"Reference definitions:\n");
    std::__cxx11::ostringstream::str();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_690);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_690);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
  }
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          *)&it);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  switch(iVar6) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    pSVar11 = de::details::
              UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
              ::operator->(&(this->m_executor).
                            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          );
    pVVar3 = outputs.out1.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    pIVar15 = (IVal *)&local_1b8;
    ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&in0.m_data[3].m_hi,0);
    (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,(ulong)pVVar3 & 0xffffffff,outputArr + 1);
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)local_6f8);
    Void::Void((Void *)((long)&reference0.m_data[3].m_hi + 7));
    Void::Void((Void *)((long)&reference0.m_data[3].m_hi + 6));
    Void::Void((Void *)((long)&reference0.m_data[3].m_hi + 5));
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&reference1.m_data[3].m_hi);
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&valueNdx);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_> *)
                         &this->m_variables);
    Environment::bind<tcu::Vector<float,4>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,(IVal *)local_6f8);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&reference0.m_data[3].m_hi + 7));
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&reference0.m_data[3].m_hi + 6));
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)((long)&reference0.m_data[3].m_hi + 5));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                        (&(this->m_variables).out0.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                        );
    Environment::bind<tcu::Vector<float,4>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)&reference1.m_data[3].m_hi);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                        (&(this->m_variables).out1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                        );
    Environment::bind<tcu::Vector<float,4>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,(IVal *)&valueNdx);
    pVStack_7c8 = (pointer)0x0;
  }
  do {
    if (outputs.out1.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= pVStack_7c8) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        tcu::TestLog::operator<<(&local_f78,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_f78,(char (*) [10])"(Skipped ");
        local_f7c = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_f7c);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_f78);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        tcu::TestLog::operator<<(&local_1100,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_1100,(char (*) [5])"All ");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1100);
      }
      else {
        tcu::TestLog::operator<<(&local_1280,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_1280,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x12bd752);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1280);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1308,"Pass",&local_1309)
        ;
        tcu::TestStatus::pass(__return_storage_ptr__,&local_1308);
        std::__cxx11::string::~string((string *)&local_1308);
        std::allocator<char>::~allocator(&local_1309);
      }
      else {
        de::toString<int>(&local_12c0,
                          (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12e0," test failed. Check log for the details",&local_12e1);
        std::operator+(&local_12a0,&local_12c0,&local_12e0);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_12a0);
        std::__cxx11::string::~string((string *)&local_12a0);
        std::__cxx11::string::~string((string *)&local_12e0);
        std::allocator<char>::~allocator(&local_12e1);
        std::__cxx11::string::~string((string *)&local_12c0);
      }
      local_12e8 = 1;
      tcu::ResultCollector::~ResultCollector((ResultCollector *)&testLog);
      Environment::~Environment((Environment *)((long)&status.m_message.field_2 + 8));
      Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>::
      ~Outputs((Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
                *)&highpFmt.m_maxValue);
      Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ::~Inputs((Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)&fmt);
      return __return_storage_ptr__;
    }
    bVar4 = true;
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&reference1_1.m_data[3].m_hi);
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)auStack_898);
    pFVar14 = (FloatFormat *)
              std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &fmt,(size_type)pVStack_7c8);
    round<tcu::Vector<float,4>>
              (&local_958,(shaderexecutor *)fmt_00,pFVar14,(Vector<float,_4> *)pIVar15);
    convert<tcu::Vector<float,4>>
              (&local_8f8,(shaderexecutor *)fmt_00,(FloatFormat *)&local_958,pIVar15);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_> *)
                         &this->m_variables);
    pIVar15 = Environment::lookup<tcu::Vector<float,4>>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    pIVar15->m_data[3].m_lo = local_8f8.m_data[3].m_lo;
    pIVar15->m_data[3].m_hi = local_8f8.m_data[3].m_hi;
    pIVar15->m_data[2].m_hi = local_8f8.m_data[2].m_hi;
    pIVar15->m_data[3].m_hasNaN = local_8f8.m_data[3].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[3].field_0x1 = local_8f8.m_data[3]._1_7_;
    pIVar15->m_data[2].m_hasNaN = local_8f8.m_data[2].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[2].field_0x1 = local_8f8.m_data[2]._1_7_;
    pIVar15->m_data[2].m_lo = local_8f8.m_data[2].m_lo;
    pIVar15->m_data[1].m_lo = local_8f8.m_data[1].m_lo;
    pIVar15->m_data[1].m_hi = local_8f8.m_data[1].m_hi;
    pIVar15->m_data[0].m_hi = local_8f8.m_data[0].m_hi;
    pIVar15->m_data[1].m_hasNaN = local_8f8.m_data[1].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[1].field_0x1 = local_8f8.m_data[1]._1_7_;
    pIVar15->m_data[0].m_hasNaN = local_8f8.m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[0].field_0x1 = local_8f8.m_data[0]._1_7_;
    pIVar15->m_data[0].m_lo = local_8f8.m_data[0].m_lo;
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in0.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_7c8);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,local_95a);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in1.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_7c8);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,local_95e);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in2.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_7c8);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
    pIVar15 = (IVal *)((long)&status.m_message.field_2 + 8);
    EvalContext::EvalContext
              ((EvalContext *)local_9a8,fmt_00,(this->m_caseCtx).precision,(Environment *)pIVar15,0)
    ;
    pSVar9 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                       (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
    Statement::execute(pSVar9,(EvalContext *)local_9a8);
    if (iVar7 == 1) {
LAB_00fc3b65:
      pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::
                operator*(&(this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                         );
      pFVar14 = (FloatFormat *)
                Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
      convert<tcu::Vector<float,4>>((IVal *)local_a90,(shaderexecutor *)&numErrors,pFVar14,pIVar15);
      reference1_1.m_data[3].m_hi = local_a90[0];
      pvVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&highpFmt.m_maxValue,(size_type)pVStack_7c8);
      bVar5 = contains<tcu::Vector<float,4>>((IVal *)&reference1_1.m_data[3].m_hi,pvVar17);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar5 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar5,&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        bVar4 = false;
      }
    }
    else if (iVar7 == 2) {
      pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::
                operator*(&(this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                         );
      pFVar14 = (FloatFormat *)
                Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
      convert<tcu::Vector<float,4>>((IVal *)local_a08,(shaderexecutor *)&numErrors,pFVar14,pIVar15);
      reference1_1.m_data[3]._0_8_ = local_9b8;
      reference1_1.m_data[3].m_lo = dStack_9b0;
      reference1_1.m_data[2].m_lo = local_9c8;
      reference1_1.m_data[2].m_hi = dStack_9c0;
      reference1_1.m_data[1].m_hi = local_9d8;
      reference1_1.m_data[2]._0_8_ = dStack_9d0;
      reference1_1.m_data[1]._0_8_ = local_9e8;
      reference1_1.m_data[1].m_lo = dStack_9e0;
      reference1_1.m_data[0].m_lo = (double)local_a08._16_8_;
      reference1_1.m_data[0].m_hi = (double)local_a08._24_8_;
      auStack_898 = (undefined1  [8])local_a08._0_8_;
      reference1_1.m_data[0]._0_8_ = local_a08._8_8_;
      pvVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&outputs.out0.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)pVStack_7c8);
      bVar4 = contains<tcu::Vector<float,4>>((IVal *)auStack_898,pvVar17);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a28,"Shader output 1 is outside acceptable range",&local_a29);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_a28);
      std::__cxx11::string::~string((string *)&local_a28);
      std::allocator<char>::~allocator(&local_a29);
      bVar4 = ((bVar4 ^ 0xffU) & 1) == 0;
      goto LAB_00fc3b65;
    }
    if ((!bVar4) &&
       (env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1,
       (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      tcu::TestLog::message((MessageBuilder *)local_c38,this_03);
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_c38,(char (*) [7])"Failed");
      tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])" sample:\n");
      if (0 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::
                  operator->((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              *)&this->m_variables);
        Variable<tcu::Vector<float,4>>::getName_abi_cxx11_(&local_c58,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c58);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)&fmt,(size_type)pVStack_7c8);
        valueToString<tcu::Vector<float,4>>
                  (&local_c78,(shaderexecutor *)&numErrors,pFVar14,(Vector<float,_4> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c78);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_c78);
        std::__cxx11::string::~string((string *)&local_c58);
      }
      if (1 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_c98,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c98);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in0.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_7c8);
        valueToString<vkt::shaderexecutor::Void>(&local_cb8,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_cb8);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::__cxx11::string::~string((string *)&local_c98);
      }
      if (2 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in2.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_cd8,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_cd8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in1.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_7c8);
        valueToString<vkt::shaderexecutor::Void>(&local_cf8,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_cf8);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_cf8);
        std::__cxx11::string::~string((string *)&local_cd8);
      }
      if (3 < iVar6) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in3.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_d18,pVVar13);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_d18);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in2.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_7c8);
        valueToString<vkt::shaderexecutor::Void>(&local_d38,(FloatFormat *)&numErrors,pvVar16);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_d38);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_d38);
        std::__cxx11::string::~string((string *)&local_d18);
      }
      if (0 < iVar7) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::
                  operator->(&(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                            );
        Variable<tcu::Vector<float,4>>::getName_abi_cxx11_(&local_d58,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_d58);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)&highpFmt.m_maxValue,(size_type)pVStack_7c8);
        valueToString<tcu::Vector<float,4>>
                  (&local_d78,(shaderexecutor *)&numErrors,pFVar14,(Vector<float,_4> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_d78);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Vector<float,4>>
                  (&local_d98,(shaderexecutor *)&numErrors,
                   (FloatFormat *)&reference1_1.m_data[3].m_hi,pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_d98);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_d98);
        std::__cxx11::string::~string((string *)&local_d78);
        std::__cxx11::string::~string((string *)&local_d58);
      }
      if (1 < iVar7) {
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_c38,(char (*) [2])0x12be862);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::
                  operator->(&(this->m_variables).out1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                            );
        Variable<tcu::Vector<float,4>>::getName_abi_cxx11_(&local_db8,pVVar12);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_db8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1331044);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)&outputs.out0.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pVStack_7c8);
        valueToString<tcu::Vector<float,4>>
                  (&local_dd8,(shaderexecutor *)&numErrors,pFVar14,(Vector<float,_4> *)pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_dd8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Vector<float,4>>
                  (&local_df8,(shaderexecutor *)&numErrors,(FloatFormat *)auStack_898,pIVar15);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_df8);
        tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_df8);
        std::__cxx11::string::~string((string *)&local_dd8);
        std::__cxx11::string::~string((string *)&local_db8);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_c38,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_c38);
    }
    pVStack_7c8 = (pointer)((long)pVStack_7c8->m_data + 1);
  } while( true );
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}